

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_unitsWithUnit_Test::Clone_unitsWithUnit_Test(Clone_unitsWithUnit_Test *this)

{
  Clone_unitsWithUnit_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Clone_unitsWithUnit_Test_00124d78;
  return;
}

Assistant:

TEST(Clone, unitsWithUnit)
{
    auto u = libcellml::Units::create();

    u->setId("unique_id");
    u->setName("units");
    u->addUnit(libcellml::Units::StandardUnit::LUMEN);
    u->addUnit("metre", "milli", -2.0);

    auto uClone = u->clone();

    compareUnits(u, uClone);
}